

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

char * pfl_listen(char *desthost,int destport,char *srcaddr,int port,ConnectionLayer *cl,Conf *conf,
                 PortListener **pl_ret,int address_family)

{
  _Bool _Var1;
  PortListener *pl_00;
  char *pcVar2;
  Socket *pSVar3;
  char *err_ret;
  PortListener *pl;
  char *err;
  Conf *conf_local;
  ConnectionLayer *cl_local;
  int port_local;
  char *srcaddr_local;
  int destport_local;
  char *desthost_local;
  
  pl_00 = new_portlistener_state();
  *pl_ret = pl_00;
  (pl_00->plug).vt = &PortListener_plugvt;
  if (desthost == (char *)0x0) {
    pl_00->is_dynamic = true;
  }
  else {
    pcVar2 = dupstr(desthost);
    pl_00->hostname = pcVar2;
    pl_00->port = destport;
    pl_00->is_dynamic = false;
  }
  pl_00->cl = cl;
  _Var1 = conf_get_bool(conf,0xae);
  pSVar3 = new_listener(srcaddr,port,&pl_00->plug,(_Bool)((_Var1 ^ 0xffU) & 1),conf,address_family);
  pl_00->s = pSVar3;
  pcVar2 = sk_socket_error(pl_00->s);
  if (pcVar2 == (char *)0x0) {
    desthost_local = (char *)0x0;
  }
  else {
    desthost_local = dupstr(pcVar2);
    sk_close(pl_00->s);
    free_portlistener_state(pl_00);
    *pl_ret = (PortListener *)0x0;
  }
  return desthost_local;
}

Assistant:

static char *pfl_listen(const char *desthost, int destport,
                        const char *srcaddr, int port,
                        ConnectionLayer *cl, Conf *conf,
                        struct PortListener **pl_ret, int address_family)
{
    const char *err;
    struct PortListener *pl;

    /*
     * Open socket.
     */
    pl = *pl_ret = new_portlistener_state();
    pl->plug.vt = &PortListener_plugvt;
    if (desthost) {
        pl->hostname = dupstr(desthost);
        pl->port = destport;
        pl->is_dynamic = false;
    } else
        pl->is_dynamic = true;
    pl->cl = cl;

    pl->s = new_listener(srcaddr, port, &pl->plug,
                         !conf_get_bool(conf, CONF_lport_acceptall),
                         conf, address_family);
    if ((err = sk_socket_error(pl->s)) != NULL) {
        char *err_ret = dupstr(err);
        sk_close(pl->s);
        free_portlistener_state(pl);
        *pl_ret = NULL;
        return err_ret;
    }

    return NULL;
}